

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::SetComputedNameVar
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this,
          Var computedNameVar)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *local_28;
  JavascriptString *functionName;
  
  Memory::Recycler::WBSetBit((char *)&this->computedNameVar);
  (this->computedNameVar).ptr = computedNameVar;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->computedNameVar);
  if ((((this->super_FunctionWithHomeObj<Js::ScriptFunction>).super_ScriptFunction.
        super_ScriptFunctionBase.super_JavascriptFunction.functionInfo.ptr)->attributes &
      ClassConstructor) != None) {
    local_28 = (JavascriptString *)0x0;
    bVar2 = JavascriptFunction::GetFunctionName((JavascriptFunction *)this,&local_28);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x3b6,"(result)","result");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    DynamicObject::SetSlot((DynamicObject *)this,-1,false,2,local_28);
  }
  return;
}

Assistant:

void FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>::SetComputedNameVar(Var computedNameVar)
    {
        this->computedNameVar = computedNameVar; 
        if (GetFunctionInfo()->IsClassConstructor())
        {
            // For class with computed name, we wait until now to set the name property.
            JavascriptString * functionName = nullptr;
            bool result = GetFunctionName(&functionName);
            Assert(result);
            SetSlot(SetSlotArguments(Constants::NoProperty, 2, functionName));
        }
    }